

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O3

bool __thiscall tlx::CmdlineParser::process(CmdlineParser *this,int argc,char **argv,ostream *os)

{
  pointer ppAVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  pointer ppAVar5;
  size_t sVar6;
  long *plVar7;
  bool bVar8;
  Argument *pAVar9;
  char *pcVar10;
  pointer ppAVar11;
  CmdlineParser *this_00;
  char cVar12;
  ulong uVar13;
  pointer ppAVar14;
  uint uVar15;
  char **ppcVar16;
  uint local_74;
  CmdlineParser *local_70;
  char **local_68;
  string local_60;
  ostream *local_40;
  char *local_38;
  
  this->program_name_ = *argv;
  uVar15 = argc - 1;
  ppcVar16 = argv + 1;
  local_74 = uVar15;
  local_70 = this;
  local_68 = ppcVar16;
  if (1 < argc) {
    uVar13 = 0;
    do {
      pcVar10 = ppcVar16[uVar13];
      if ((((*pcVar10 == '-') && (pcVar10[1] == 'h')) && (this_00 = local_70, pcVar10[2] == '\0'))
         || (iVar3 = strcmp(pcVar10,"--help"), this_00 = local_70, iVar3 == 0)) goto LAB_0014f37f;
      uVar13 = uVar13 + 1;
    } while (uVar15 != uVar13);
  }
  ppAVar11 = (local_70->param_list_).
             super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  this_00 = local_70;
  if (uVar15 != 0) {
    bVar2 = false;
    local_40 = os;
    do {
      pcVar10 = *local_68;
      cVar12 = (char)os;
      if (*pcVar10 == '-' && !bVar2) {
        uVar15 = uVar15 - 1;
        local_68 = local_68 + 1;
        local_74 = uVar15;
        if (pcVar10[1] == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(os,"Invalid option \"",0x10);
          sVar6 = strlen(pcVar10);
          std::__ostream_insert<char,std::char_traits<char>>(os,pcVar10,sVar6);
          std::__ostream_insert<char,std::char_traits<char>>(os,"\".",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar12);
          std::ostream::put(cVar12);
          std::ostream::flush();
          this_00 = local_70;
LAB_0014f047:
          bVar2 = false;
        }
        else {
          local_38 = pcVar10;
          if (pcVar10[1] == '-') {
            bVar2 = true;
            if (pcVar10[2] != '-') {
              ppAVar5 = (this_00->option_list_).
                        super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (ppAVar5 !=
                  (this_00->option_list_).
                  super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0014ed5a:
                iVar3 = std::__cxx11::string::compare((char *)&(*ppAVar5)->longkey_);
                if (iVar3 != 0) goto code_r0x0014ed71;
                iVar3 = (*(*ppAVar5)->_vptr_Argument[3])(*ppAVar5,&local_74,&local_68);
                if ((char)iVar3 == '\0') {
                  pAVar9 = *ppAVar5;
LAB_0014f27a:
                  print_option_error(local_70,local_74,local_68,pAVar9,os);
                  goto LAB_0014f384;
                }
                this_00 = local_70;
                if (local_70->verbose_process_ == true) {
                  std::__ostream_insert<char,std::char_traits<char>>(os,"Option ",7);
                  Argument::option_text_abi_cxx11_(&local_60,*ppAVar5);
                  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                     (os,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                                          (char)local_60._M_dataplus._M_p),
                                      local_60._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4," set to ",8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p)
                      != &local_60.field_2) {
                    operator_delete((undefined1 *)
                                    CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                             (char)local_60._M_dataplus._M_p),
                                    local_60.field_2._M_allocated_capacity + 1);
                  }
                  (*(*ppAVar5)->_vptr_Argument[4])(*ppAVar5,os);
                  local_60._M_dataplus._M_p._0_1_ = '.';
                  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                     (os,(char *)&local_60,1);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
                  std::ostream::put((char)poVar4);
                  std::ostream::flush();
                  this_00 = local_70;
                }
              }
LAB_0014f03d:
              if (ppAVar5 !=
                  (this_00->option_list_).
                  super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0014f047;
              std::__ostream_insert<char,std::char_traits<char>>(os,"Error: unknown option \"",0x17)
              ;
              pcVar10 = local_38;
              sVar6 = strlen(local_38);
              std::__ostream_insert<char,std::char_traits<char>>(os,pcVar10,sVar6);
              std::__ostream_insert<char,std::char_traits<char>>(os,"\".",2);
              std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar12);
              std::ostream::put(cVar12);
              plVar7 = (long *)std::ostream::flush();
              cVar12 = (char)plVar7;
              std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + cVar12);
              goto LAB_0014f135;
            }
          }
          else {
            sVar6 = strlen(pcVar10);
            uVar13 = 1;
            pcVar10 = local_38;
            this_00 = local_70;
            while ((bVar2 = false, os = local_40, uVar13 < sVar6 && (local_74 == uVar15))) {
              ppAVar5 = (this_00->option_list_).
                        super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppAVar1 = (this_00->option_list_).
                        super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              ppAVar14 = ppAVar5;
              if (ppAVar5 != ppAVar1) {
                do {
                  pAVar9 = *ppAVar5;
                  if (pcVar10[uVar13] == pAVar9->key_) {
                    iVar3 = (*pAVar9->_vptr_Argument[3])(pAVar9,&local_74,&local_68);
                    poVar4 = local_40;
                    if ((char)iVar3 == '\0') {
                      pAVar9 = *ppAVar5;
                      os = local_40;
                      goto LAB_0014f27a;
                    }
                    uVar13 = uVar13 + 1;
                    pcVar10 = local_38;
                    this_00 = local_70;
                    ppAVar14 = ppAVar5;
                    if (local_70->verbose_process_ == true) {
                      std::__ostream_insert<char,std::char_traits<char>>(local_40,"Option ",7);
                      Argument::option_text_abi_cxx11_(&local_60,*ppAVar5);
                      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar4,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                                                  (char)local_60._M_dataplus._M_p),
                                          local_60._M_string_length);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar4," set to ",8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                      (char)local_60._M_dataplus._M_p) != &local_60.field_2) {
                        operator_delete((undefined1 *)
                                        CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                                 (char)local_60._M_dataplus._M_p),
                                        local_60.field_2._M_allocated_capacity + 1);
                      }
                      poVar4 = local_40;
                      (*(*ppAVar5)->_vptr_Argument[4])(*ppAVar5,local_40);
                      local_60._M_dataplus._M_p._0_1_ = '.';
                      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                         (poVar4,(char *)&local_60,1);
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4)
                      ;
                      std::ostream::put((char)poVar4);
                      std::ostream::flush();
                      pcVar10 = local_38;
                      this_00 = local_70;
                    }
                    break;
                  }
                  ppAVar5 = ppAVar5 + 1;
                  ppAVar14 = ppAVar1;
                } while (ppAVar5 != ppAVar1);
              }
              os = local_40;
              if (ppAVar14 ==
                  (this_00->option_list_).
                  super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                std::__ostream_insert<char,std::char_traits<char>>
                          (local_40,"Error: unknown option \"",0x17);
                if (2 < sVar6) {
                  std::__ostream_insert<char,std::char_traits<char>>(os,"-",1);
                  local_60._M_dataplus._M_p._0_1_ = local_38[uVar13];
                  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                     (os,(char *)&local_60,1);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" at position ",0xe);
                  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar4," in option sequence \"",0x15);
                }
                pcVar10 = local_38;
                sVar6 = strlen(local_38);
                std::__ostream_insert<char,std::char_traits<char>>(os,pcVar10,sVar6);
                std::__ostream_insert<char,std::char_traits<char>>(os,"\".",2);
                std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
                std::ostream::put((char)os);
                plVar7 = (long *)std::ostream::flush();
                std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
                std::ostream::put((char)plVar7);
                std::ostream::flush();
                this_00 = local_70;
                goto LAB_0014f37f;
              }
            }
          }
        }
      }
      else {
        if (ppAVar11 ==
            (this_00->param_list_).
            super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,"Error: unexpected extra argument ",0x21);
          std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
          pcVar10 = *local_68;
          if (pcVar10 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(*(long *)os + -0x18) + (int)os);
          }
          else {
            sVar6 = strlen(pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>(os,pcVar10,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,"\".",2);
          std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar12);
          std::ostream::put(cVar12);
          plVar7 = (long *)std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
          std::ostream::put((char)plVar7);
          std::ostream::flush();
          local_74 = local_74 - 1;
          local_68 = local_68 + 1;
          this_00 = local_70;
          goto LAB_0014f37f;
        }
        iVar3 = (*(*ppAVar11)->_vptr_Argument[3])(*ppAVar11,&local_74,&local_68);
        if ((char)iVar3 == '\0') {
          print_param_error(local_70,local_74,local_68,*ppAVar11,os);
          goto LAB_0014f384;
        }
        if (local_70->verbose_process_ == true) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"Parameter ",10);
          Argument::param_text_abi_cxx11_(&local_60,*ppAVar11);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                                  (char)local_60._M_dataplus._M_p),
                              local_60._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," set to ",8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
              &local_60.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p
                                    ),local_60.field_2._M_allocated_capacity + 1);
          }
          (*(*ppAVar11)->_vptr_Argument[4])(*ppAVar11,os);
          local_60._M_dataplus._M_p._0_1_ = '.';
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_60,1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
        }
        pAVar9 = *ppAVar11;
        pAVar9->found_ = true;
        ppAVar11 = ppAVar11 + (pAVar9->repeated_ ^ 1);
        this_00 = local_70;
      }
      uVar15 = local_74;
    } while (local_74 != 0);
    ppAVar11 = (this_00->param_list_).
               super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  ppAVar5 = (this_00->param_list_).
            super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppAVar11 == ppAVar5) {
    bVar2 = true;
  }
  else {
    bVar8 = true;
    do {
      while (((*ppAVar11)->required_ == true && ((*ppAVar11)->found_ != true))) {
        std::__ostream_insert<char,std::char_traits<char>>(os,"Error: argument for parameter ",0x1e)
        ;
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (os,((*ppAVar11)->longkey_)._M_dataplus._M_p,
                            ((*ppAVar11)->longkey_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," is required!",0xd);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        ppAVar5 = (local_70->param_list_).
                  super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        ppAVar11 = ppAVar11 + 1;
        bVar8 = false;
        this_00 = local_70;
        if (ppAVar11 == ppAVar5) goto LAB_0014f117;
      }
      ppAVar11 = ppAVar11 + 1;
    } while (ppAVar11 != ppAVar5);
    bVar2 = true;
    if (!bVar8) {
LAB_0014f117:
      cVar12 = (char)os;
      std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar12);
LAB_0014f135:
      std::ostream::put(cVar12);
      std::ostream::flush();
LAB_0014f37f:
      print_usage(this_00,os);
LAB_0014f384:
      bVar2 = false;
    }
  }
  return bVar2;
code_r0x0014ed71:
  ppAVar5 = ppAVar5 + 1;
  this_00 = local_70;
  if (ppAVar5 ==
      (local_70->option_list_).
      super__Vector_base<tlx::CmdlineParser::Argument_*,_std::allocator<tlx::CmdlineParser::Argument_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0014f03d;
  goto LAB_0014ed5a;
}

Assistant:

bool CmdlineParser::process(
    int argc, const char* const* argv, std::ostream& os) {
    program_name_ = argv[0];
    --argc, ++argv;

    // search for help string and output help
    for (int i = 0; i < argc; ++i) {
        if (strcmp(argv[i], "-h") == 0 || strcmp(argv[i], "--help") == 0) {
            print_usage(os);
            return false;
        }
    }

    // current argument in param_list_
    ArgumentList::iterator argi = param_list_.begin();
    bool end_optlist = false;

    while (argc != 0) {
        const char* arg = argv[0];

        if (arg[0] == '-' && !end_optlist) {
            // option, advance to argument
            --argc, ++argv;
            if (arg[1] == '-') {
                if (arg[2] == '-') {
                    end_optlist = true;
                }
                else {
                    // long option
                    ArgumentList::const_iterator oi = option_list_.begin();
                    for ( ; oi != option_list_.end(); ++oi) {
                        if ((arg + 2) == (*oi)->longkey_) {
                            if (!(*oi)->process(argc, argv)) {
                                print_option_error(argc, argv, *oi, os);
                                return false;
                            }
                            else if (verbose_process_) {
                                os << "Option " << (*oi)->option_text()
                                   << " set to ";
                                (*oi)->print_value(os);
                                os << '.' << std::endl;
                            }
                            break;
                        }
                    }
                    if (oi == option_list_.end()) {
                        os << "Error: unknown option \"" << arg << "\"."
                           << std::endl << std::endl;
                        print_usage(os);
                        return false;
                    }
                }
            }
            else {
                // short option
                if (arg[1] == 0) {
                    os << "Invalid option \"" << arg << "\"." << std::endl;
                }
                else {
                    size_t offset = 1, arg_length = strlen(arg);
                    int old_argc = argc;
                    // Arguments will increase argc, so abort if it increases,
                    // while flags won't, so increase offset and parse next
                    while (offset < arg_length && argc == old_argc) {
                        ArgumentList::const_iterator oi = option_list_.begin();
                        for ( ; oi != option_list_.end(); ++oi) {
                            if (arg[offset] == (*oi)->key_) {
                                ++offset;
                                if (!(*oi)->process(argc, argv)) {
                                    print_option_error(argc, argv, *oi, os);
                                    return false;
                                }
                                else if (verbose_process_) {
                                    os << "Option "
                                       << (*oi)->option_text()
                                       << " set to ";
                                    (*oi)->print_value(os);
                                    os << '.' << std::endl;
                                }
                                break;
                            }
                        }
                        if (oi == option_list_.end()) {
                            os << "Error: unknown option \"";
                            if (arg_length > 2) {
                                // multiple short options combined
                                os << "-" << arg[offset]
                                   << "\" at position " << offset
                                   << " in option sequence \"";
                            }
                            os << arg << "\"." << std::endl << std::endl;
                            print_usage(os);
                            return false;
                        }
                    }
                }
            }
        }
        else {
            if (argi != param_list_.end()) {
                if (!(*argi)->process(argc, argv)) {
                    print_param_error(argc, argv, *argi, os);
                    return false;
                }
                else if (verbose_process_) {
                    os << "Parameter " << (*argi)->param_text() << " set to ";
                    (*argi)->print_value(os);
                    os << '.' << std::endl;
                }
                (*argi)->found_ = true;
                if (!(*argi)->repeated_)
                    ++argi;
            }
            else {
                os << "Error: unexpected extra argument "
                   << "\"" << argv[0] << "\"." << std::endl << std::endl;
                --argc, ++argv;
                print_usage(os);
                return false;
            }
        }
    }

    bool good = true;

    for (ArgumentList::const_iterator it = param_list_.begin();
         it != param_list_.end(); ++it) {
        if ((*it)->required_ && !(*it)->found_) {
            os << "Error: argument for parameter " << (*it)->longkey_
               << " is required!" << std::endl;
            good = false;
        }
    }

    if (!good) {
        os << std::endl;
        print_usage(os);
    }

    return good;
}